

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_find_files.cpp
# Opt level: O3

bool __thiscall
crnlib::find_files::find(find_files *this,char *pBasepath,char *pFilespec,uint flags)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  file_desc *this_00;
  
  uVar2 = (ulong)(this->m_files).m_size;
  if (uVar2 != 0) {
    this_00 = (this->m_files).m_p;
    lVar3 = uVar2 * 0x48;
    do {
      file_desc::~file_desc(this_00);
      this_00 = this_00 + 1;
      lVar3 = lVar3 + -0x48;
    } while (lVar3 != 0);
    (this->m_files).m_size = 0;
  }
  bVar1 = find_internal(this,pBasepath,"",pFilespec,flags,0);
  return bVar1;
}

Assistant:

bool find_files::find(const char* pBasepath, const char* pFilespec, uint flags)
    {
        m_files.resize(0);
        return find_internal(pBasepath, "", pFilespec, flags, 0);
    }